

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateGenericFunctionPrototype
               (ExpressionTranslateContext *ctx,ExprGenericFunctionPrototype *expression)

{
  ExprVariableDefinition *local_20;
  ExprBase *curr;
  ExprGenericFunctionPrototype *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  Print(ctx,"/* Definition of generic function prototype \'%.*s\' */",
        (ulong)(uint)((int)(expression->function->name->name).end -
                     (int)(expression->function->name->name).begin),
        (expression->function->name->name).begin);
  if ((expression->contextVariables).head == (ExprVariableDefinition *)0x0) {
    Print(ctx,"0");
  }
  else {
    Print(ctx,"(");
    PrintLine(ctx);
    ctx->depth = ctx->depth + 1;
    for (local_20 = (expression->contextVariables).head; local_20 != (ExprVariableDefinition *)0x0;
        local_20 = (ExprVariableDefinition *)(local_20->super_ExprBase).next) {
      PrintIndent(ctx);
      Translate(ctx,&local_20->super_ExprBase);
      if ((local_20->super_ExprBase).next != (ExprBase *)0x0) {
        Print(ctx,", ");
      }
      PrintLine(ctx);
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    Print(ctx,")");
  }
  return;
}

Assistant:

void TranslateGenericFunctionPrototype(ExpressionTranslateContext &ctx, ExprGenericFunctionPrototype *expression)
{
	Print(ctx, "/* Definition of generic function prototype '%.*s' */", FMT_ISTR(expression->function->name->name));

	if(!expression->contextVariables.head)
	{
		Print(ctx, "0");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(ExprBase *curr = expression->contextVariables.head; curr; curr = curr->next)
	{
		PrintIndent(ctx);

		Translate(ctx, curr);

		if(curr->next)
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}